

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdEmuD3D56TexOffset::emulate_mthd(MthdEmuD3D56TexOffset *this)

{
  pgraph_state *state;
  uint32_t *puVar1;
  uint32_t val;
  bool bVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar5 = 0x4000;
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    if (((uint)this->which >> (int)lVar4 & 1) != 0) {
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
        val = (this->super_SingleMthdTest).super_MthdTest.val;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_offset[lVar4] =
             val;
        pgraph_celsius_icmd(state,(int)lVar4,val,true);
      }
      puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
      *puVar1 = *puVar1 | uVar5;
    }
    lVar4 = 1;
    uVar5 = 0x400000;
    bVar2 = false;
  } while (bVar3);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
       chipset.chipset != 0x10) && (this->which == 3)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[0] = 4;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		for (int j = 0; j < 2; j++) {
			if (which & (1 << j)) {
				if (!extr(exp.nsource, 1, 1)) {
					exp.bundle_tex_offset[j] = val;
					pgraph_celsius_icmd(&exp, j, val, true);
				}
				insrt(exp.valid[1], j ? 22 : 14, 1, 1);
			}
		}
		if (chipset.chipset != 0x10 && which == 3) {
			exp.celsius_pipe_junk[0] = 4;
		}
	}